

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidget::isAncestorOf(QWidget *this,QWidget *child)

{
  bool bVar1;
  
  if (child == (QWidget *)0x0) {
    return false;
  }
  while( true ) {
    bVar1 = child == this;
    if (bVar1) {
      return bVar1;
    }
    if (((child->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
    child = *(QWidget **)(*(long *)&child->field_0x8 + 0x10);
    if (child == (QWidget *)0x0) {
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool QWidget::isAncestorOf(const QWidget *child) const
{
    while (child) {
        if (child == this)
            return true;
        if (child->isWindow())
            return false;
        child = child->parentWidget();
    }
    return false;
}